

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.h
# Opt level: O0

void SHA1_transform(uint32_t *state,uchar *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  void *in_RSI;
  uint *in_RDI;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  CHAR64LONG16 block [1];
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint *local_8;
  
  local_8 = in_RDI;
  memcpy(&local_58,in_RSI,0x40);
  uVar4 = *local_8;
  uVar2 = local_8[1];
  uVar5 = local_8[2];
  uVar3 = local_8[3];
  uVar6 = local_58 << 0x18 | local_58 >> 8 & 0xff00ff00 |
          (local_58 & 0xff00) << 8 | local_58 >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 << 5 | uVar4 >> 0x1b) +
          local_8[4];
  uVar2 = uVar2 << 0x1e | uVar2 >> 2;
  uVar7 = local_54 << 0x18 | local_54 >> 8 & 0xff00ff00 |
          (local_54 & 0xff00) << 8 | local_54 >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar7 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 << 0x1e | uVar4 >> 2;
  uVar8 = local_50 << 0x18 | local_50 >> 8 & 0xff00ff00 |
          (local_50 & 0xff00) << 8 | local_50 >> 0x18;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar8 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar9 = local_4c << 0x18 | local_4c >> 8 & 0xff00ff00 |
          (local_4c & 0xff00) << 8 | local_4c >> 0x18;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar9 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar10 = local_48 << 0x18 | local_48 >> 8 & 0xff00ff00 |
           (local_48 & 0xff00) << 8 | local_48 >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar10 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar11 = local_44 << 0x18 | local_44 >> 8 & 0xff00ff00 |
           (local_44 & 0xff00) << 8 | local_44 >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar11 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar12 = local_40 << 0x18 | local_40 >> 8 & 0xff00ff00 |
           (local_40 & 0xff00) << 8 | local_40 >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar12 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar13 = local_3c << 0x18 | local_3c >> 8 & 0xff00ff00 |
           (local_3c & 0xff00) << 8 | local_3c >> 0x18;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar13 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar14 = local_38 << 0x18 | local_38 >> 8 & 0xff00ff00 |
           (local_38 & 0xff00) << 8 | local_38 >> 0x18;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar14 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar15 = local_34 << 0x18 | local_34 >> 8 & 0xff00ff00 |
           (local_34 & 0xff00) << 8 | local_34 >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar15 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar16 = local_30 << 0x18 | local_30 >> 8 & 0xff00ff00 |
           (local_30 & 0xff00) << 8 | local_30 >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar16 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar17 = local_2c << 0x18 | local_2c >> 8 & 0xff00ff00 |
           (local_2c & 0xff00) << 8 | local_2c >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar17 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar18 = local_28 << 0x18 | local_28 >> 8 & 0xff00ff00 |
           (local_28 & 0xff00) << 8 | local_28 >> 0x18;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar18 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar19 = local_24 << 0x18 | local_24 >> 8 & 0xff00ff00 |
           (local_24 & 0xff00) << 8 | local_24 >> 0x18;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar19 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar20 = local_20 << 0x18 | local_20 >> 8 & 0xff00ff00 |
           (local_20 & 0xff00) << 8 | local_20 >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar20 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar21 = local_1c << 0x18 | local_1c >> 8 & 0xff00ff00 |
           (local_1c & 0xff00) << 8 | local_1c >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar21 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar7 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar8 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar9 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar10 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar11 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar12 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar13 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar14 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar15 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar16 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar17 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar18 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar19 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar20 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar21 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar7 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar8 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar9 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar10 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar11 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar12 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar13 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar14 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar15 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar16 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar17 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar18 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar19 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar20 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar21 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar8 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar9 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar10 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar11 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar12 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar13 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar14 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar15 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar16 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar17 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar18 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar19 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar20 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar21 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar22 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar22 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar8 = (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar8 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar9 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar9 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar10 = (uVar6 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar6 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar10 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar11 = (uVar8 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar8 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar11 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar12 = (uVar9 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar9 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar12 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar13 = (uVar10 ^ uVar22 ^ uVar16 ^ uVar14) << 1 | (uVar10 ^ uVar22 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar13 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar14 = (uVar11 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar11 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar14 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar15 = (uVar12 ^ uVar6 ^ uVar18 ^ uVar16) << 1 | (uVar12 ^ uVar6 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar15 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar8 = (uVar13 ^ uVar8 ^ uVar19 ^ uVar17) << 1 | (uVar13 ^ uVar8 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar8 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar6 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = (uVar14 ^ uVar9 ^ uVar20 ^ uVar18) << 1 | (uVar14 ^ uVar9 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar3 = (uVar4 ^ uVar6 ^ uVar5) + uVar9 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar5 = (uVar1 ^ uVar4 ^ uVar6) +
          ((uVar15 ^ uVar10 ^ uVar21 ^ uVar19) << 1 | (uVar15 ^ uVar10 ^ uVar21 ^ uVar19) >> 0x1f) +
          -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar2 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (uVar3 ^ uVar2 ^ uVar4) +
          ((uVar8 ^ uVar11 ^ uVar22 ^ uVar20) << 1 | (uVar8 ^ uVar11 ^ uVar22 ^ uVar20) >> 0x1f) +
          -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar6;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  *local_8 = (uVar5 ^ uVar3 ^ uVar2) +
             ((uVar9 ^ uVar12 ^ uVar7 ^ uVar21) << 1 | (uVar9 ^ uVar12 ^ uVar7 ^ uVar21) >> 0x1f) +
             -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar4 + *local_8;
  local_8[1] = uVar6 + local_8[1];
  local_8[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + local_8[2];
  local_8[3] = uVar3 + local_8[3];
  local_8[4] = uVar2 + local_8[4];
  return;
}

Assistant:

void SHA1_transform(uint32_t state[5], const unsigned char buffer[64])
{
	typedef union
	{
		unsigned char c[64];
		uint32_t l[16];
	} CHAR64LONG16;

	CHAR64LONG16 block[1]; /* use array to appear as a pointer */
	memcpy(block, buffer, 64);

	/* Copy context->state[] to working vars */
	uint32_t a = state[0];
	uint32_t b = state[1];
	uint32_t c = state[2];
	uint32_t d = state[3];
	uint32_t e = state[4];

	/* 4 rounds of 20 operations each. Loop unrolled. */
	R0(a, b, c, d, e, 0);
	R0(e, a, b, c, d, 1);
	R0(d, e, a, b, c, 2);
	R0(c, d, e, a, b, 3);
	R0(b, c, d, e, a, 4);
	R0(a, b, c, d, e, 5);
	R0(e, a, b, c, d, 6);
	R0(d, e, a, b, c, 7);
	R0(c, d, e, a, b, 8);
	R0(b, c, d, e, a, 9);
	R0(a, b, c, d, e, 10);
	R0(e, a, b, c, d, 11);
	R0(d, e, a, b, c, 12);
	R0(c, d, e, a, b, 13);
	R0(b, c, d, e, a, 14);
	R0(a, b, c, d, e, 15);
	R1(e, a, b, c, d, 16);
	R1(d, e, a, b, c, 17);
	R1(c, d, e, a, b, 18);
	R1(b, c, d, e, a, 19);
	R2(a, b, c, d, e, 20);
	R2(e, a, b, c, d, 21);
	R2(d, e, a, b, c, 22);
	R2(c, d, e, a, b, 23);
	R2(b, c, d, e, a, 24);
	R2(a, b, c, d, e, 25);
	R2(e, a, b, c, d, 26);
	R2(d, e, a, b, c, 27);
	R2(c, d, e, a, b, 28);
	R2(b, c, d, e, a, 29);
	R2(a, b, c, d, e, 30);
	R2(e, a, b, c, d, 31);
	R2(d, e, a, b, c, 32);
	R2(c, d, e, a, b, 33);
	R2(b, c, d, e, a, 34);
	R2(a, b, c, d, e, 35);
	R2(e, a, b, c, d, 36);
	R2(d, e, a, b, c, 37);
	R2(c, d, e, a, b, 38);
	R2(b, c, d, e, a, 39);
	R3(a, b, c, d, e, 40);
	R3(e, a, b, c, d, 41);
	R3(d, e, a, b, c, 42);
	R3(c, d, e, a, b, 43);
	R3(b, c, d, e, a, 44);
	R3(a, b, c, d, e, 45);
	R3(e, a, b, c, d, 46);
	R3(d, e, a, b, c, 47);
	R3(c, d, e, a, b, 48);
	R3(b, c, d, e, a, 49);
	R3(a, b, c, d, e, 50);
	R3(e, a, b, c, d, 51);
	R3(d, e, a, b, c, 52);
	R3(c, d, e, a, b, 53);
	R3(b, c, d, e, a, 54);
	R3(a, b, c, d, e, 55);
	R3(e, a, b, c, d, 56);
	R3(d, e, a, b, c, 57);
	R3(c, d, e, a, b, 58);
	R3(b, c, d, e, a, 59);
	R4(a, b, c, d, e, 60);
	R4(e, a, b, c, d, 61);
	R4(d, e, a, b, c, 62);
	R4(c, d, e, a, b, 63);
	R4(b, c, d, e, a, 64);
	R4(a, b, c, d, e, 65);
	R4(e, a, b, c, d, 66);
	R4(d, e, a, b, c, 67);
	R4(c, d, e, a, b, 68);
	R4(b, c, d, e, a, 69);
	R4(a, b, c, d, e, 70);
	R4(e, a, b, c, d, 71);
	R4(d, e, a, b, c, 72);
	R4(c, d, e, a, b, 73);
	R4(b, c, d, e, a, 74);
	R4(a, b, c, d, e, 75);
	R4(e, a, b, c, d, 76);
	R4(d, e, a, b, c, 77);
	R4(c, d, e, a, b, 78);
	R4(b, c, d, e, a, 79);

	/* Add the working vars back into context.state[] */
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
}